

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

logic_t __thiscall slang::SVInt::operator<(SVInt *this,SVInt *rhs)

{
  bool bVar1;
  bitwidth_t bVar2;
  bitwidth_t bVar3;
  SVInt *in_RSI;
  SVInt *in_RDI;
  int i;
  uint32_t top;
  bitwidth_t a2;
  bitwidth_t a1;
  bool bothSigned;
  undefined4 in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff80;
  bitwidth_t in_stack_ffffffffffffff84;
  SVInt *in_stack_ffffffffffffff88;
  byte local_69;
  uint32_t local_60;
  SVInt local_30;
  undefined7 in_stack_ffffffffffffffe0;
  logic_t local_1;
  
  if ((((in_RDI->super_SVIntStorage).unknownFlag & 1U) != 0) || (bVar1 = hasUnknown(in_RSI), bVar1))
  {
    return (logic_t)0x80;
  }
  local_69 = 0;
  if (((in_RDI->super_SVIntStorage).signFlag & 1U) != 0) {
    local_69 = (in_RSI->super_SVIntStorage).signFlag;
  }
  local_69 = local_69 & 1;
  if ((in_RDI->super_SVIntStorage).bitWidth != (in_RSI->super_SVIntStorage).bitWidth) {
    bVar1 = SUB41((uint)in_stack_ffffffffffffff80 >> 0x18,0);
    if ((in_RDI->super_SVIntStorage).bitWidth < (in_RSI->super_SVIntStorage).bitWidth) {
      extend(&local_30,in_stack_ffffffffffffff84,bVar1);
      local_1 = operator<(in_RSI,(SVInt *)CONCAT17(local_69,in_stack_ffffffffffffffe0));
      ~SVInt((SVInt *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      return (logic_t)local_1.value;
    }
    extend(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,bVar1);
    local_1 = operator<(in_RSI,(SVInt *)CONCAT17(local_69,in_stack_ffffffffffffffe0));
    ~SVInt((SVInt *)CONCAT44(CONCAT13(local_1.value,(int3)in_stack_ffffffffffffff84),
                             in_stack_ffffffffffffff80));
    return (logic_t)local_1.value;
  }
  if (local_69 != 0) {
    bVar1 = isNegative((SVInt *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    in_stack_ffffffffffffff74 = (uint)bVar1;
    bVar1 = isNegative((SVInt *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffff70));
    if (in_stack_ffffffffffffff74 != bVar1) {
      bVar1 = isNegative((SVInt *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      logic_t::logic_t(&local_1,bVar1);
      return (logic_t)local_1.value;
    }
  }
  bVar1 = isSingleWord(in_RDI);
  if (bVar1) {
    logic_t::logic_t(&local_1,(in_RDI->super_SVIntStorage).field_0.val <
                              (in_RSI->super_SVIntStorage).field_0.val);
    return (logic_t)local_1.value;
  }
  bVar2 = getActiveBits((SVInt *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  bVar3 = getActiveBits((SVInt *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if (bVar2 < bVar3) {
    logic_t::logic_t(&local_1,'\x01');
    return (logic_t)local_1.value;
  }
  if (bVar3 < bVar2) {
    logic_t::logic_t(&local_1,'\0');
    return (logic_t)local_1.value;
  }
  if (bVar2 == 0) {
    logic_t::logic_t(&local_1,'\0');
    return (logic_t)local_1.value;
  }
  local_60 = whichWord(bVar2 - 1);
  while( true ) {
    if ((int)local_60 < 0) {
      logic_t::logic_t(&local_1,'\0');
      return (logic_t)local_1.value;
    }
    if ((in_RSI->super_SVIntStorage).field_0.pVal[(int)local_60] <
        (in_RDI->super_SVIntStorage).field_0.pVal[(int)local_60]) break;
    if ((in_RDI->super_SVIntStorage).field_0.pVal[(int)local_60] <
        (in_RSI->super_SVIntStorage).field_0.pVal[(int)local_60]) {
      logic_t::logic_t(&local_1,'\x01');
      return (logic_t)local_1.value;
    }
    local_60 = local_60 - 1;
  }
  logic_t::logic_t(&local_1,'\0');
  return (logic_t)local_1.value;
}

Assistant:

logic_t SVInt::operator<(const SVInt& rhs) const {
    if (unknownFlag || rhs.hasUnknown())
        return logic_t::x;

    bool bothSigned = signFlag && rhs.signFlag;
    if (bitWidth != rhs.bitWidth) {
        if (bitWidth < rhs.bitWidth)
            return extend(rhs.bitWidth, bothSigned) < rhs;
        else
            return *this < rhs.extend(bitWidth, bothSigned);
    }
    // handle signed negatives
    if (bothSigned && isNegative() ^ rhs.isNegative())
        return logic_t(isNegative());

    // both are positive or both are negative
    // or not both are signed
    if (isSingleWord())
        return logic_t(val < rhs.val);

    bitwidth_t a1 = getActiveBits();
    bitwidth_t a2 = rhs.getActiveBits();
    if (a1 < a2)
        return logic_t(true);
    if (a2 < a1)
        return logic_t(false);
    if (a1 == 0)
        return logic_t(false); // both values are zero

    // same number of words, compare each one until there's no match
    uint32_t top = whichWord(a1 - 1);
    for (int i = int(top); i >= 0; i--) {
        if (pVal[i] > rhs.pVal[i])
            return logic_t(false);
        if (pVal[i] < rhs.pVal[i])
            return logic_t(true);
    }
    return logic_t(false);
}